

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall helics::MessageFederate::~MessageFederate(MessageFederate *this)

{
  MessageFederate *in_stack_00000010;
  
  ~MessageFederate(in_stack_00000010);
  return;
}

Assistant:

void MessageFederate::loadFederateData()
{
    mfManager = std::make_unique<MessageFederateManager>(coreObject.get(),
                                                         this,
                                                         getID(),
                                                         singleThreadFederate);
    if (!configFile.empty()) {
        MessageFederate::registerMessageInterfaces(configFile);
    }
}